

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

lostFraction __thiscall
llvm::detail::IEEEFloat::addOrSubtractSignificand(IEEEFloat *this,IEEEFloat *rhs,bool subtract)

{
  short sVar1;
  short sVar2;
  lostFraction lVar3;
  cmpResult cVar4;
  lostFraction lVar5;
  integerPart iVar6;
  uint bits;
  lostFraction lVar7;
  IEEEFloat temp_rhs;
  
  sVar1 = this->exponent;
  sVar2 = rhs->exponent;
  bits = (int)sVar1 - (int)sVar2;
  if ((((rhs->field_0x12 ^ this->field_0x12) & 8) == 0) != subtract) {
    if ((int)bits < 1) {
      lVar3 = shiftSignificandRight(this,-bits);
      iVar6 = addSignificand(this,rhs);
    }
    else {
      IEEEFloat(&temp_rhs,rhs);
      lVar3 = shiftSignificandRight(&temp_rhs,bits);
      iVar6 = addSignificand(this,&temp_rhs);
      ~IEEEFloat(&temp_rhs);
    }
    if (iVar6 == 0) {
      return lVar3;
    }
    __assert_fail("!carry",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x5db,
                  "lostFraction llvm::detail::IEEEFloat::addOrSubtractSignificand(const IEEEFloat &, bool)"
                 );
  }
  IEEEFloat(&temp_rhs,rhs);
  if (sVar1 == sVar2) {
    cVar4 = compareAbsoluteValue(this,&temp_rhs);
    lVar3 = lfExactlyZero;
    if (cVar4 != cmpLessThan) {
LAB_001611fa:
      iVar6 = subtractSignificand(this,&temp_rhs,(ulong)(lVar3 != lfExactlyZero));
      goto LAB_0016129e;
    }
  }
  else {
    if (0 < (int)bits) {
      lVar3 = shiftSignificandRight(&temp_rhs,bits - 1);
      shiftSignificandLeft(this,1);
      goto LAB_001611fa;
    }
    lVar3 = shiftSignificandRight(this,~bits);
    shiftSignificandLeft(&temp_rhs,1);
  }
  iVar6 = subtractSignificand(&temp_rhs,this,(ulong)(lVar3 != lfExactlyZero));
  copySignificand(this,&temp_rhs);
  this->field_0x12 = this->field_0x12 ^ 8;
LAB_0016129e:
  if (iVar6 == 0) {
    lVar5 = lfLessThanHalf;
    if (lVar3 != lfMoreThanHalf) {
      lVar5 = lVar3;
    }
    lVar7 = lfMoreThanHalf;
    if (lVar3 != lfLessThanHalf) {
      lVar7 = lVar5;
    }
    ~IEEEFloat(&temp_rhs);
    return lVar7;
  }
  __assert_fail("!carry",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x5cd,
                "lostFraction llvm::detail::IEEEFloat::addOrSubtractSignificand(const IEEEFloat &, bool)"
               );
}

Assistant:

lostFraction IEEEFloat::addOrSubtractSignificand(const IEEEFloat &rhs,
                                                 bool subtract) {
  integerPart carry;
  lostFraction lost_fraction;
  int bits;

  /* Determine if the operation on the absolute values is effectively
     an addition or subtraction.  */
  subtract ^= static_cast<bool>(sign ^ rhs.sign);

  /* Are we bigger exponent-wise than the RHS?  */
  bits = exponent - rhs.exponent;

  /* Subtraction is more subtle than one might naively expect.  */
  if (subtract) {
    IEEEFloat temp_rhs(rhs);
    bool reverse;

    if (bits == 0) {
      reverse = compareAbsoluteValue(temp_rhs) == cmpLessThan;
      lost_fraction = lfExactlyZero;
    } else if (bits > 0) {
      lost_fraction = temp_rhs.shiftSignificandRight(bits - 1);
      shiftSignificandLeft(1);
      reverse = false;
    } else {
      lost_fraction = shiftSignificandRight(-bits - 1);
      temp_rhs.shiftSignificandLeft(1);
      reverse = true;
    }

    if (reverse) {
      carry = temp_rhs.subtractSignificand
        (*this, lost_fraction != lfExactlyZero);
      copySignificand(temp_rhs);
      sign = !sign;
    } else {
      carry = subtractSignificand
        (temp_rhs, lost_fraction != lfExactlyZero);
    }

    /* Invert the lost fraction - it was on the RHS and
       subtracted.  */
    if (lost_fraction == lfLessThanHalf)
      lost_fraction = lfMoreThanHalf;
    else if (lost_fraction == lfMoreThanHalf)
      lost_fraction = lfLessThanHalf;

    /* The code above is intended to ensure that no borrow is
       necessary.  */
    assert(!carry);
    (void)carry;
  } else {
    if (bits > 0) {
      IEEEFloat temp_rhs(rhs);

      lost_fraction = temp_rhs.shiftSignificandRight(bits);
      carry = addSignificand(temp_rhs);
    } else {
      lost_fraction = shiftSignificandRight(-bits);
      carry = addSignificand(rhs);
    }

    /* We have a guard bit; generating a carry cannot happen.  */
    assert(!carry);
    (void)carry;
  }

  return lost_fraction;
}